

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O0

void CompiledMixedType<long_long,unsigned_short>(void)

{
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs_00;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs_01;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs_02;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_00;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs_03;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs_04;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_01;
  unsigned_short u2;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> st2;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> su
  ;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> st;
  bool b;
  longlong t;
  unsigned_short u;
  undefined6 in_stack_fffffffffffffce8;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffcee;
  undefined4 in_stack_fffffffffffffcf0;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffcf4;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffcf6;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffcf8;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffd00;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> SVar1;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffd08;
  undefined6 in_stack_fffffffffffffd10;
  unsigned_short in_stack_fffffffffffffd16;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffd18;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  SVar2;
  longlong local_30;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_22;
  longlong local_20;
  byte local_11;
  longlong local_10;
  unsigned_short local_2;
  
  local_2 = 0;
  local_10 = 0;
  local_11 = 0;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<unsigned_short>
            ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffcf6.m_int,
                         CONCAT24(in_stack_fffffffffffffcf4.m_int,in_stack_fffffffffffffcf0)),
             (unsigned_short *)CONCAT26(in_stack_fffffffffffffcee.m_int,in_stack_fffffffffffffce8));
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt(&local_22,&local_2);
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<unsigned_short>
            ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffd00.m_int,
             (SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int);
  local_11 = (local_11 ^ 0xff) & 1;
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd00.m_int,(longlong *)in_stack_fffffffffffffcf8.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd00.m_int,(unsigned_short *)in_stack_fffffffffffffcf8.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT26(in_stack_fffffffffffffcf6.m_int,
                        CONCAT24(in_stack_fffffffffffffcf4.m_int,in_stack_fffffffffffffcf0)),
            (SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT26(in_stack_fffffffffffffcee.m_int,in_stack_fffffffffffffce8));
  local_20 = local_30;
  SafeInt::operator_cast_to_unsigned_short
            ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffcf6.m_int,
                         CONCAT24(in_stack_fffffffffffffcf4.m_int,in_stack_fffffffffffffcf0)));
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator*((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffcf6.m_int);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT26(in_stack_fffffffffffffcf6.m_int,
                                    CONCAT24(in_stack_fffffffffffffcf4.m_int,
                                             in_stack_fffffffffffffcf0)));
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator*((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd00.m_int,in_stack_fffffffffffffd08);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT26(in_stack_fffffffffffffcf6.m_int,
                                    CONCAT24(in_stack_fffffffffffffcf4.m_int,
                                             in_stack_fffffffffffffcf0)));
  operator*(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf8);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT26(in_stack_fffffffffffffcf6.m_int,
                                    CONCAT24(in_stack_fffffffffffffcf4.m_int,
                                             in_stack_fffffffffffffcf0)));
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator*=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffcf6.m_int,
                         CONCAT24(in_stack_fffffffffffffcf4.m_int,in_stack_fffffffffffffcf0)),
             in_stack_fffffffffffffcee.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator*=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffcee.m_int,in_stack_fffffffffffffce8),
             in_stack_fffffffffffffcf6);
  local_2 = 1;
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd00.m_int,(int *)in_stack_fffffffffffffcf8.m_int);
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd00.m_int,(int *)in_stack_fffffffffffffcf8.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator%((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffcf6.m_int);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT26(in_stack_fffffffffffffcf6.m_int,
                                    CONCAT24(in_stack_fffffffffffffcf4.m_int,
                                             in_stack_fffffffffffffcf0)));
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd00.m_int,(int *)in_stack_fffffffffffffcf8.m_int);
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator%((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd00.m_int,in_stack_fffffffffffffd08);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT26(in_stack_fffffffffffffcf6.m_int,
                                    CONCAT24(in_stack_fffffffffffffcf4.m_int,
                                             in_stack_fffffffffffffcf0)));
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator%=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffcf6.m_int,
                         CONCAT24(in_stack_fffffffffffffcf4.m_int,in_stack_fffffffffffffcf0)),
             in_stack_fffffffffffffcee.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator%=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,
             (SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              )(unsigned_short)((ulong)in_stack_fffffffffffffd00.m_int >> 0x30));
  local_2 = 1;
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd00.m_int,(int *)in_stack_fffffffffffffcf8.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd00.m_int,(int *)in_stack_fffffffffffffcf8.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator/((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffcf6.m_int);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT26(in_stack_fffffffffffffcf6.m_int,
                                    CONCAT24(in_stack_fffffffffffffcf4.m_int,
                                             in_stack_fffffffffffffcf0)));
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator/((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd00.m_int,in_stack_fffffffffffffd08);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT26(in_stack_fffffffffffffcf6.m_int,
                                    CONCAT24(in_stack_fffffffffffffcf4.m_int,
                                             in_stack_fffffffffffffcf0)));
  operator/(in_stack_fffffffffffffd16,in_stack_fffffffffffffd18);
  SVar2.m_int = (unsigned_short)((ulong)in_stack_fffffffffffffd18.m_int >> 0x30);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT26(in_stack_fffffffffffffcf6.m_int,
                                    CONCAT24(in_stack_fffffffffffffcf4.m_int,
                                             in_stack_fffffffffffffcf0)));
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator/=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffcf6.m_int,
                         CONCAT24(in_stack_fffffffffffffcf4.m_int,in_stack_fffffffffffffcf0)),
             in_stack_fffffffffffffcee.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator/=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,
             (SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              )(unsigned_short)((ulong)in_stack_fffffffffffffd00.m_int >> 0x30));
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator+((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffcf6.m_int);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT26(in_stack_fffffffffffffcf6.m_int,
                                    CONCAT24(in_stack_fffffffffffffcf4.m_int,
                                             in_stack_fffffffffffffcf0)));
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator+((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd00.m_int,in_stack_fffffffffffffd08);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT26(in_stack_fffffffffffffcf6.m_int,
                                    CONCAT24(in_stack_fffffffffffffcf4.m_int,
                                             in_stack_fffffffffffffcf0)));
  operator+(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf8);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT26(in_stack_fffffffffffffcf6.m_int,
                                    CONCAT24(in_stack_fffffffffffffcf4.m_int,
                                             in_stack_fffffffffffffcf0)));
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator+=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffcf6.m_int,
                         CONCAT24(in_stack_fffffffffffffcf4.m_int,in_stack_fffffffffffffcf0)),
             in_stack_fffffffffffffcee.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator+=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,
             (SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              )(unsigned_short)((ulong)in_stack_fffffffffffffd00.m_int >> 0x30));
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd00.m_int,(int *)in_stack_fffffffffffffcf8.m_int);
  local_2 = 0;
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd00.m_int,(int *)in_stack_fffffffffffffcf8.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator-((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffcf6.m_int);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT26(in_stack_fffffffffffffcf6.m_int,
                                    CONCAT24(in_stack_fffffffffffffcf4.m_int,
                                             in_stack_fffffffffffffcf0)));
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator-((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd00.m_int,in_stack_fffffffffffffd08);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT26(in_stack_fffffffffffffcf6.m_int,
                                    CONCAT24(in_stack_fffffffffffffcf4.m_int,
                                             in_stack_fffffffffffffcf0)));
  operator-(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf8);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT26(in_stack_fffffffffffffcf6.m_int,
                                    CONCAT24(in_stack_fffffffffffffcf4.m_int,
                                             in_stack_fffffffffffffcf0)));
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator-=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffcf6.m_int,
                         CONCAT24(in_stack_fffffffffffffcf4.m_int,in_stack_fffffffffffffcf0)),
             in_stack_fffffffffffffcee.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd00.m_int,(int *)in_stack_fffffffffffffcf8.m_int);
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd00.m_int,(int *)in_stack_fffffffffffffcf8.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator-=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,
             (SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              )(unsigned_short)((ulong)in_stack_fffffffffffffd00.m_int >> 0x30));
  local_2 = 1;
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd00.m_int,(int *)in_stack_fffffffffffffcf8.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator<<((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffcf6.m_int);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT26(in_stack_fffffffffffffcf6.m_int,
                                    CONCAT24(in_stack_fffffffffffffcf4.m_int,
                                             in_stack_fffffffffffffcf0)));
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator<<((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffd16,in_stack_fffffffffffffd10),SVar2);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT26(in_stack_fffffffffffffcf6.m_int,
                                    CONCAT24(in_stack_fffffffffffffcf4.m_int,
                                             in_stack_fffffffffffffcf0)));
  operator<<(in_stack_fffffffffffffd00.m_int,
             (SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              )(unsigned_short)((ulong)in_stack_fffffffffffffd08.m_int >> 0x30));
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT26(in_stack_fffffffffffffcf6.m_int,
                                    CONCAT24(in_stack_fffffffffffffcf4.m_int,
                                             in_stack_fffffffffffffcf0)));
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator<<=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               *)CONCAT26(in_stack_fffffffffffffcf6.m_int,
                          CONCAT24(in_stack_fffffffffffffcf4.m_int,in_stack_fffffffffffffcf0)),
              in_stack_fffffffffffffcee.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator<<=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               *)in_stack_fffffffffffffcf8.m_int,
              (SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               )(unsigned_short)((ulong)in_stack_fffffffffffffd00.m_int >> 0x30));
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator>>((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffcf6.m_int);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT26(in_stack_fffffffffffffcf6.m_int,
                                    CONCAT24(in_stack_fffffffffffffcf4.m_int,
                                             in_stack_fffffffffffffcf0)));
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator>>((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffd16,in_stack_fffffffffffffd10),SVar2);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT26(in_stack_fffffffffffffcf6.m_int,
                                    CONCAT24(in_stack_fffffffffffffcf4.m_int,
                                             in_stack_fffffffffffffcf0)));
  operator>>(in_stack_fffffffffffffd00.m_int,
             (SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              )(unsigned_short)((ulong)in_stack_fffffffffffffd08.m_int >> 0x30));
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT26(in_stack_fffffffffffffcf6.m_int,
                                    CONCAT24(in_stack_fffffffffffffcf4.m_int,
                                             in_stack_fffffffffffffcf0)));
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator>>=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               *)CONCAT26(in_stack_fffffffffffffcf6.m_int,
                          CONCAT24(in_stack_fffffffffffffcf4.m_int,in_stack_fffffffffffffcf0)),
              in_stack_fffffffffffffcee.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator>>=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               *)in_stack_fffffffffffffcf8.m_int,
              (SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               )(unsigned_short)((ulong)in_stack_fffffffffffffd00.m_int >> 0x30));
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator&((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd00.m_int,in_stack_fffffffffffffd08);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT26(in_stack_fffffffffffffcf6.m_int,
                                    CONCAT24(in_stack_fffffffffffffcf4.m_int,
                                             in_stack_fffffffffffffcf0)));
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator&((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffcf6.m_int);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT26(in_stack_fffffffffffffcf6.m_int,
                                    CONCAT24(in_stack_fffffffffffffcf4.m_int,
                                             in_stack_fffffffffffffcf0)));
  operator&(CONCAT26(in_stack_fffffffffffffcee.m_int,in_stack_fffffffffffffce8),
            in_stack_fffffffffffffcf4);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT26(in_stack_fffffffffffffcf6.m_int,
                                    CONCAT24(in_stack_fffffffffffffcf4.m_int,
                                             in_stack_fffffffffffffcf0)));
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator&=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffd00);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator&=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffcf6.m_int,
                         CONCAT24(in_stack_fffffffffffffcf4.m_int,in_stack_fffffffffffffcf0)),
             in_stack_fffffffffffffcee.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator&=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,
             (SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              )(unsigned_short)((ulong)in_stack_fffffffffffffd00.m_int >> 0x30));
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator|((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd00.m_int,in_stack_fffffffffffffd08);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT26(in_stack_fffffffffffffcf6.m_int,
                                    CONCAT24(in_stack_fffffffffffffcf4.m_int,
                                             in_stack_fffffffffffffcf0)));
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator|((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffcf6.m_int);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT26(in_stack_fffffffffffffcf6.m_int,
                                    CONCAT24(in_stack_fffffffffffffcf4.m_int,
                                             in_stack_fffffffffffffcf0)));
  operator|(CONCAT26(in_stack_fffffffffffffcee.m_int,in_stack_fffffffffffffce8),
            in_stack_fffffffffffffcf4);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT26(in_stack_fffffffffffffcf6.m_int,
                                    CONCAT24(in_stack_fffffffffffffcf4.m_int,
                                             in_stack_fffffffffffffcf0)));
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator|=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffd00);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator|=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffcf6.m_int,
                         CONCAT24(in_stack_fffffffffffffcf4.m_int,in_stack_fffffffffffffcf0)),
             in_stack_fffffffffffffcee.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator|=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,
             (SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              )(unsigned_short)((ulong)in_stack_fffffffffffffd00.m_int >> 0x30));
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator^((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd00.m_int,in_stack_fffffffffffffd08);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT26(in_stack_fffffffffffffcf6.m_int,
                                    CONCAT24(in_stack_fffffffffffffcf4.m_int,
                                             in_stack_fffffffffffffcf0)));
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator^((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffcf6.m_int);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT26(in_stack_fffffffffffffcf6.m_int,
                                    CONCAT24(in_stack_fffffffffffffcf4.m_int,
                                             in_stack_fffffffffffffcf0)));
  operator^(CONCAT26(in_stack_fffffffffffffcee.m_int,in_stack_fffffffffffffce8),
            in_stack_fffffffffffffcf4);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT26(in_stack_fffffffffffffcf6.m_int,
                                    CONCAT24(in_stack_fffffffffffffcf4.m_int,
                                             in_stack_fffffffffffffcf0)));
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator^=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffd00);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator^=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffcf6.m_int,
                         CONCAT24(in_stack_fffffffffffffcf4.m_int,in_stack_fffffffffffffcf0)),
             in_stack_fffffffffffffcee.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator^=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,
             (SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              )(unsigned_short)((ulong)in_stack_fffffffffffffd00.m_int >> 0x30));
  SVar2.m_int = (unsigned_short)((ulong)in_stack_fffffffffffffcf8.m_int >> 0x30);
  SVar1.m_int._4_2_ = in_stack_fffffffffffffcf4.m_int;
  SVar1.m_int._0_4_ = in_stack_fffffffffffffcf0;
  SVar1.m_int._6_2_ = in_stack_fffffffffffffcf6.m_int;
  local_11 = operator<(SVar1,in_stack_fffffffffffffcee);
  local_11 = operator<(in_stack_fffffffffffffd00,SVar2.m_int);
  rhs.m_int._4_2_ = in_stack_fffffffffffffcf4.m_int;
  rhs.m_int._0_4_ = in_stack_fffffffffffffcf0;
  rhs.m_int._6_2_ = in_stack_fffffffffffffcf6.m_int;
  local_11 = operator<(in_stack_fffffffffffffcee.m_int,rhs);
  lhs.m_int._4_2_ = in_stack_fffffffffffffcf4.m_int;
  lhs.m_int._0_4_ = in_stack_fffffffffffffcf0;
  lhs.m_int._6_2_ = in_stack_fffffffffffffcf6.m_int;
  local_11 = operator<(lhs,in_stack_fffffffffffffcee);
  local_11 = operator<=(in_stack_fffffffffffffd00,SVar2);
  lhs_00.m_int._4_2_ = in_stack_fffffffffffffcf4.m_int;
  lhs_00.m_int._0_4_ = in_stack_fffffffffffffcf0;
  lhs_00.m_int._6_2_ = in_stack_fffffffffffffcf6.m_int;
  local_11 = operator<=(lhs_00,in_stack_fffffffffffffcee.m_int);
  local_11 = operator<=(SVar2.m_int,in_stack_fffffffffffffd00);
  local_11 = operator<=(in_stack_fffffffffffffd00,SVar2);
  local_11 = operator>(in_stack_fffffffffffffd00,SVar2);
  lhs_01.m_int._4_2_ = in_stack_fffffffffffffcf4.m_int;
  lhs_01.m_int._0_4_ = in_stack_fffffffffffffcf0;
  lhs_01.m_int._6_2_ = in_stack_fffffffffffffcf6.m_int;
  local_11 = operator>(lhs_01,in_stack_fffffffffffffcee.m_int);
  local_11 = operator>(SVar2.m_int,in_stack_fffffffffffffd00);
  local_11 = operator>(in_stack_fffffffffffffd00,SVar2);
  lhs_02.m_int._4_2_ = in_stack_fffffffffffffcf4.m_int;
  lhs_02.m_int._0_4_ = in_stack_fffffffffffffcf0;
  lhs_02.m_int._6_2_ = in_stack_fffffffffffffcf6.m_int;
  local_11 = operator>=(lhs_02,in_stack_fffffffffffffcee);
  local_11 = operator>=(in_stack_fffffffffffffd00,SVar2.m_int);
  rhs_00.m_int._4_2_ = in_stack_fffffffffffffcf4.m_int;
  rhs_00.m_int._0_4_ = in_stack_fffffffffffffcf0;
  rhs_00.m_int._6_2_ = in_stack_fffffffffffffcf6.m_int;
  local_11 = operator>=(in_stack_fffffffffffffcee.m_int,rhs_00);
  lhs_03.m_int._4_2_ = in_stack_fffffffffffffcf4.m_int;
  lhs_03.m_int._0_4_ = in_stack_fffffffffffffcf0;
  lhs_03.m_int._6_2_ = in_stack_fffffffffffffcf6.m_int;
  local_11 = operator>=(lhs_03,in_stack_fffffffffffffcee);
  local_11 = operator==(in_stack_fffffffffffffd00,SVar2);
  lhs_04.m_int._4_2_ = in_stack_fffffffffffffcf4.m_int;
  lhs_04.m_int._0_4_ = in_stack_fffffffffffffcf0;
  lhs_04.m_int._6_2_ = in_stack_fffffffffffffcf6.m_int;
  local_11 = operator==(lhs_04,in_stack_fffffffffffffcee.m_int);
  rhs_01.m_int._4_2_ = in_stack_fffffffffffffcf4.m_int;
  rhs_01.m_int._0_4_ = in_stack_fffffffffffffcf0;
  rhs_01.m_int._6_2_ = in_stack_fffffffffffffcf6.m_int;
  SVar1.m_int = local_20;
  local_11 = operator==(in_stack_fffffffffffffcee.m_int,rhs_01);
  operator==(SVar1,(SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                    )(unsigned_short)((ulong)local_20 >> 0x30));
  return;
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}